

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O1

int log_aspect_reserve(log_aspect aspect,size_t size)

{
  size_t sVar1;
  log_policy *pplVar2;
  int iVar3;
  
  sVar1 = log_valid_size(size);
  iVar3 = 1;
  if (0xfffffffffffffeff < sVar1 - 0x101) {
    if (aspect->policies != (log_policy *)0x0) {
      free(aspect->policies);
    }
    pplVar2 = (log_policy *)malloc(sVar1 * 8);
    aspect->policies = pplVar2;
    if (pplVar2 != (log_policy *)0x0) {
      aspect->count = 0;
      aspect->size = sVar1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int log_aspect_reserve(log_aspect aspect, size_t size)
{
	size = log_valid_size(size);

	if (size < LOG_ASPECT_POLICIES_MIN_SIZE || size > LOG_ASPECT_POLICIES_MAX_SIZE)
	{
		return 1;
	}

	if (aspect->policies != NULL)
	{
		free(aspect->policies);
	}

	aspect->policies = malloc(sizeof(log_policy) * size);

	if (aspect->policies == NULL)
	{
		return 1;
	}

	aspect->count = 0;
	aspect->size = size;

	return 0;
}